

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestCamelCaseFieldNames::SharedDtor(MessageLite *self)

{
  ForeignMessage *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestCamelCaseFieldNames *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestCamelCaseFieldNames *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[9]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 10));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[10]._internal_metadata_);
    this = (ForeignMessage *)local_18[0xb]._vptr_MessageLite;
    if (this != (ForeignMessage *)0x0) {
      proto2_unittest::ForeignMessage::~ForeignMessage(this);
      operator_delete(this,0x20);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
             ,0x6a83,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestCamelCaseFieldNames::SharedDtor(MessageLite& self) {
  TestCamelCaseFieldNames& this_ = static_cast<TestCamelCaseFieldNames&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.stringfield_.Destroy();
  this_._impl_.stringpiecefield_.Destroy();
  this_._impl_.cordfield_.Destroy();
  delete this_._impl_.messagefield_;
  this_._impl_.~Impl_();
}